

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O0

void __thiscall adios2::aggregator::MPIChain::HandshakeLinks(MPIChain *this)

{
  long in_RDI;
  Req receiveRequest;
  Req sendRequest;
  int link;
  Req *req;
  Req *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffec8;
  Req *in_stack_fffffffffffffed0;
  allocator local_e9;
  string local_e8 [63];
  allocator local_a9;
  string local_a8 [39];
  undefined1 local_81 [33];
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  Comm *in_stack_ffffffffffffffb8;
  Req local_40 [2];
  string *in_stack_ffffffffffffffd0;
  
  helper::Comm::Req::Req((Req *)0xd70fa4);
  if (0 < *(int *)(in_RDI + 0x28)) {
    in_stack_fffffffffffffed0 = (Req *)(in_RDI + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_40,"Isend handshake with neighbor, MPIChain aggregator, at Open",
               (allocator *)&stack0xffffffffffffffbf);
    req = local_40;
    helper::Comm::Isend<int>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffd0);
    helper::Comm::Req::operator=(in_stack_fffffffffffffea0,req);
    helper::Comm::Req::~Req((Req *)0xd7105e);
    std::__cxx11::string::~string((string *)local_40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  }
  if (*(int *)(in_RDI + 0x28) < *(int *)(in_RDI + 0x2c) + -1) {
    in_stack_fffffffffffffec8 = (string *)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),
               "Irecv handshake with neighbor, MPIChain aggregator, at Open",
               (allocator *)in_stack_fffffffffffffec8);
    helper::Comm::Irecv<int>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffd0);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,"Irecv Wait handshake with neighbor, MPIChain aggregator, at Open",&local_a9
              );
    helper::Comm::Req::Wait(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    helper::Comm::Req::~Req((Req *)0xd71207);
  }
  if (0 < *(int *)(in_RDI + 0x28)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e8,"Isend wait handshake with neighbor, MPIChain aggregator, at Open",&local_e9
              );
    helper::Comm::Req::Wait(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  helper::Comm::Req::~Req((Req *)0xd71369);
  return;
}

Assistant:

void MPIChain::HandshakeLinks()
{
    int link = -1;

    helper::Comm::Req sendRequest;
    if (m_Rank > 0) // send
    {
        sendRequest = m_Comm.Isend(&m_Rank, 1, m_Rank - 1, 0,
                                   "Isend handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank < m_Size - 1) // receive
    {
        helper::Comm::Req receiveRequest = m_Comm.Irecv(
            &link, 1, m_Rank + 1, 0, "Irecv handshake with neighbor, MPIChain aggregator, at Open");

        receiveRequest.Wait("Irecv Wait handshake with neighbor, MPIChain aggregator, at Open");
    }

    if (m_Rank > 0)
    {
        sendRequest.Wait("Isend wait handshake with neighbor, MPIChain aggregator, at Open");
    }
}